

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

void soul::catchParseErrors(function<void_()> *functionToPerform)

{
  ParseErrorIgnoringMessageHandler handler;
  CompileMessageHandler CStack_58;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &CStack_58;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:225:38)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:225:38)>
             ::_M_manager;
  CompileMessageHandler::CompileMessageHandler(&CStack_58,(HandleMessageFn *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  std::function<void_()>::operator()(functionToPerform);
  CompileMessageHandler::~CompileMessageHandler(&CStack_58);
  return;
}

Assistant:

void catchParseErrors (std::function<void()>&& functionToPerform)
{
    struct ErrorWasIgnoredException {};

    struct ParseErrorIgnoringMessageHandler  : public CompileMessageHandler
    {
        ParseErrorIgnoringMessageHandler()
            : CompileMessageHandler ([this] (const CompileMessageGroup& messageGroup)
                                     {
                                         for (auto& m : messageGroup.messages)
                                             if (! m.isInternalCompilerError())
                                                 throw ErrorWasIgnoredException();

                                         if (lastHandler != nullptr)
                                             lastHandler->handleMessageFn (messageGroup);
                                     })
        {}
    };

    try
    {
        ParseErrorIgnoringMessageHandler handler;
        functionToPerform();
    }
    catch (ErrorWasIgnoredException) {}
}